

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

void Abc_SclOneNodePrint(Bus_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  SC_Cell *p_00;
  char *pcVar2;
  float fVar3;
  float fVar4;
  
  p_00 = Abc_SclObjCell(pObj);
  pcVar2 = "Node";
  if ((pObj->vFanins).nSize == 0) {
    pcVar2 = " Inv";
  }
  printf("%s%7d :  ",pcVar2,(ulong)(uint)pObj->Id);
  iVar1 = (pObj->vFanins).nSize;
  printf("%d/%2d   ",(ulong)(iVar1 + (uint)(iVar1 == 0)),(ulong)(uint)(pObj->vFanouts).nSize);
  printf("%12s ",p_00->pName);
  printf("(%2d/%2d)  ",(ulong)(uint)p_00->Order,(ulong)(uint)p_00->nGates);
  fVar3 = Bus_SclObjLoad(pObj);
  fVar4 = SC_CellPinCapAve(p_00);
  printf("gain =%5d  ",(ulong)(uint)(int)((fVar3 * 100.0) / fVar4));
  fVar3 = Bus_SclObjDept(pObj);
  printf("dept =%7.0f ps  ",(double)fVar3);
  putchar(10);
  return;
}

Assistant:

void Abc_SclOneNodePrint( Bus_Man_t * p, Abc_Obj_t * pObj )
{
    SC_Cell * pCell = Abc_SclObjCell(pObj);
    printf( "%s%7d :  ",        (Abc_ObjFaninNum(pObj) == 0) ? " Inv" : "Node", Abc_ObjId(pObj) );
    printf( "%d/%2d   ",        Abc_ObjFaninNum(pObj) ? Abc_ObjFaninNum(pObj) : 1, Abc_ObjFanoutNum(pObj) );
    printf( "%12s ",            pCell->pName );
    printf( "(%2d/%2d)  ",      pCell->Order, pCell->nGates );
    printf( "gain =%5d  ",      (int)(100.0 * Bus_SclObjLoad(pObj) / SC_CellPinCapAve(pCell)) );
    printf( "dept =%7.0f ps  ", Bus_SclObjDept(pObj) );
    printf( "\n" );
}